

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

void __thiscall
polyscope::TransformationGizmo::TransformationGizmo
          (TransformationGizmo *this,string *name_,mat4 *T_,
          PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *Tpers_)

{
  undefined8 in_RCX;
  string *in_RDX;
  PersistentValue<bool> *in_RSI;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  PersistentValue<bool> *this_00;
  
  this_00 = in_RSI;
  Widget::Widget((Widget *)in_RSI);
  *in_RDI = &PTR_draw_00794c10;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)in_RSI);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  PersistentValue<bool>::PersistentValue(this_00,in_RDX,SUB81((ulong)in_RCX >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  in_RDI[10] = in_RDX;
  in_RDI[0xb] = in_RCX;
  *(undefined4 *)(in_RDI + 0xc) = 0x3da3d70a;
  *(undefined4 *)((long)in_RDI + 100) = 0x3dcccccd;
  *(undefined4 *)(in_RDI + 0xd) = 0x3fc00000;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0x3ea3d70a;
  *(undefined4 *)(in_RDI + 0xe) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  *(undefined1 *)(in_RDI + 0xf) = 0;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)((long)in_RDI + 0x7c),1.0,0.0,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)(in_RDI + 0x11),0.8274509803921568,
             0.17647058823529413,0.24313725490196078);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)((long)in_RDI + 0x94),0.2549019607843137,
             0.4745098039215686,0.8823529411764706);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)(in_RDI + 0x14),0.37254901960784315,
             0.6862745098039216,0.13725490196078433);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x380f67);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x380f78);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x380f89);
  return;
}

Assistant:

TransformationGizmo::TransformationGizmo(std::string name_, glm::mat4& T_, PersistentValue<glm::mat4>* Tpers_)
    : name(name_), enabled(name + "#name", false), T(T_), Tpers(Tpers_)

{}